

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void proxy_telnet_free(ProxyNegotiator *pn)

{
  BinarySink **ctx;
  TelnetProxyNegotiator *s;
  ProxyNegotiator *pn_local;
  
  ctx = &pn[-1].output[0].binarysink_[0].binarysink_;
  if (pn[-1].itr != (Interactor *)0x0) {
    conf_free((Conf *)pn[-1].itr);
  }
  if (pn[-1].error != (char *)0x0) {
    free_prompts((prompts_t *)pn[-1].error);
  }
  burnstr(*(char **)&pn[-1].done);
  delete_callbacks_for_context(ctx);
  safefree(ctx);
  return;
}

Assistant:

static void proxy_telnet_free(ProxyNegotiator *pn)
{
    TelnetProxyNegotiator *s = container_of(pn, TelnetProxyNegotiator, pn);
    if (s->conf)
        conf_free(s->conf);
    if (s->prompts)
        free_prompts(s->prompts);
    burnstr(s->formatted_cmd);
    delete_callbacks_for_context(s);
    sfree(s);
}